

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::GRULayerParams::Clear(GRULayerParams *this)

{
  InternalMetadata *this_00;
  WeightParams *pWVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activations_).super_RepeatedPtrFieldBase);
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  uVar2 = uVar2 & 1;
  puVar4 = puVar3;
  if (uVar2 != 0) {
    puVar4 = (undefined8 *)*puVar3;
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if ((puVar4 == (undefined8 *)0x0) &&
     (pWVar1 = this->updategateweightmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
  }
  this->updategateweightmatrix_ = (WeightParams *)0x0;
  puVar4 = puVar3;
  if (uVar2 != 0) {
    puVar4 = (undefined8 *)*puVar3;
  }
  if ((puVar4 == (undefined8 *)0x0) &&
     (pWVar1 = this->resetgateweightmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
  }
  this->resetgateweightmatrix_ = (WeightParams *)0x0;
  puVar4 = puVar3;
  if (uVar2 != 0) {
    puVar4 = (undefined8 *)*puVar3;
  }
  if ((puVar4 == (undefined8 *)0x0) &&
     (pWVar1 = this->outputgateweightmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
  }
  this->outputgateweightmatrix_ = (WeightParams *)0x0;
  puVar4 = puVar3;
  if (uVar2 != 0) {
    puVar4 = (undefined8 *)*puVar3;
  }
  if ((puVar4 == (undefined8 *)0x0) &&
     (pWVar1 = this->updategaterecursionmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
  }
  this->updategaterecursionmatrix_ = (WeightParams *)0x0;
  puVar4 = puVar3;
  if (uVar2 != 0) {
    puVar4 = (undefined8 *)*puVar3;
  }
  if ((puVar4 == (undefined8 *)0x0) &&
     (pWVar1 = this->resetgaterecursionmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
  }
  this->resetgaterecursionmatrix_ = (WeightParams *)0x0;
  puVar4 = puVar3;
  if (uVar2 != 0) {
    puVar4 = (undefined8 *)*puVar3;
  }
  if ((puVar4 == (undefined8 *)0x0) &&
     (pWVar1 = this->outputgaterecursionmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
  }
  this->outputgaterecursionmatrix_ = (WeightParams *)0x0;
  puVar4 = puVar3;
  if (uVar2 != 0) {
    puVar4 = (undefined8 *)*puVar3;
  }
  if ((puVar4 == (undefined8 *)0x0) &&
     (pWVar1 = this->updategatebiasvector_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
  }
  this->updategatebiasvector_ = (WeightParams *)0x0;
  puVar4 = puVar3;
  if (uVar2 != 0) {
    puVar4 = (undefined8 *)*puVar3;
  }
  if ((puVar4 == (undefined8 *)0x0) &&
     (pWVar1 = this->resetgatebiasvector_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
    puVar3 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
  }
  this->resetgatebiasvector_ = (WeightParams *)0x0;
  if (uVar2 != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pWVar1 = this->outputgatebiasvector_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
  }
  *(undefined8 *)((long)&this->inputvectorsize_ + 3) = 0;
  *(undefined8 *)((long)&this->outputvectorsize_ + 3) = 0;
  this->outputgatebiasvector_ = (WeightParams *)0x0;
  this->inputvectorsize_ = 0;
  if (uVar2 != 0) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(this_00);
    return;
  }
  return;
}

Assistant:

void GRULayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.GRULayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  activations_.Clear();
  if (GetArenaForAllocation() == nullptr && updategateweightmatrix_ != nullptr) {
    delete updategateweightmatrix_;
  }
  updategateweightmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && resetgateweightmatrix_ != nullptr) {
    delete resetgateweightmatrix_;
  }
  resetgateweightmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && outputgateweightmatrix_ != nullptr) {
    delete outputgateweightmatrix_;
  }
  outputgateweightmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && updategaterecursionmatrix_ != nullptr) {
    delete updategaterecursionmatrix_;
  }
  updategaterecursionmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && resetgaterecursionmatrix_ != nullptr) {
    delete resetgaterecursionmatrix_;
  }
  resetgaterecursionmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && outputgaterecursionmatrix_ != nullptr) {
    delete outputgaterecursionmatrix_;
  }
  outputgaterecursionmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && updategatebiasvector_ != nullptr) {
    delete updategatebiasvector_;
  }
  updategatebiasvector_ = nullptr;
  if (GetArenaForAllocation() == nullptr && resetgatebiasvector_ != nullptr) {
    delete resetgatebiasvector_;
  }
  resetgatebiasvector_ = nullptr;
  if (GetArenaForAllocation() == nullptr && outputgatebiasvector_ != nullptr) {
    delete outputgatebiasvector_;
  }
  outputgatebiasvector_ = nullptr;
  ::memset(&inputvectorsize_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&reverseinput_) -
      reinterpret_cast<char*>(&inputvectorsize_)) + sizeof(reverseinput_));
  _internal_metadata_.Clear<std::string>();
}